

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenStringSliceWTFSetStart(BinaryenExpressionRef expr,BinaryenExpressionRef startExpr)

{
  if (expr->_id != StringSliceWTFId) {
    __assert_fail("expression->is<StringSliceWTF>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x130b,
                  "void BinaryenStringSliceWTFSetStart(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (startExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = startExpr;
    return;
  }
  __assert_fail("startExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x130c,
                "void BinaryenStringSliceWTFSetStart(BinaryenExpressionRef, BinaryenExpressionRef)")
  ;
}

Assistant:

void BinaryenStringSliceWTFSetStart(BinaryenExpressionRef expr,
                                    BinaryenExpressionRef startExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringSliceWTF>());
  assert(startExpr);
  static_cast<StringSliceWTF*>(expression)->start = (Expression*)startExpr;
}